

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddPerm2Comb(int *pPerm,int Size,int *pComb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  
  uVar4 = 0;
  uVar5 = 0;
  if (0 < Size) {
    uVar5 = (ulong)(uint)Size;
  }
  puVar6 = (uint *)(pPerm + 1);
  iVar3 = 0;
  do {
    if (uVar4 == uVar5) {
      return iVar3;
    }
    if (uVar4 != (uint)pPerm[uVar4]) {
      uVar9 = uVar4 & 0xffffffff;
      puVar10 = puVar6;
      do {
        uVar7 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar7;
        uVar8 = Size;
        if (Size <= (int)uVar7) break;
        uVar1 = *puVar10;
        puVar10 = puVar10 + 1;
        uVar8 = uVar7;
      } while (uVar4 != uVar1);
      pComb[iVar3] = (int)uVar4 << 0x10 | uVar8;
      iVar2 = pPerm[uVar4];
      pPerm[uVar4] = pPerm[uVar8];
      pPerm[uVar8] = iVar2;
      if (uVar4 != (uint)pPerm[uVar4]) {
        __assert_fail("i == pPerm[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                      ,0x287,"int Abc_ZddPerm2Comb(int *, int, int *)");
      }
      iVar3 = iVar3 + 1;
    }
    uVar4 = uVar4 + 1;
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

int Abc_ZddPerm2Comb( int * pPerm, int Size, int * pComb )
{
    int i, j, nTrans = 0;
    for ( i = 0; i < Size; i++ )
        if ( i != pPerm[i] )
        {
            for ( j = i+1; j < Size; j++ )
                if ( i == pPerm[j] )
                    break;
            pComb[nTrans++] = (i << 16) | j;
            ABC_SWAP( int, pPerm[i], pPerm[j] );
            assert( i == pPerm[i] );
        }
    return nTrans;
}